

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaoSolver.cpp
# Opt level: O1

int __thiscall BaoSolver::check(BaoSolver *this,uint32_t s,int k)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  vector<int,_std::allocator<int>_> vec;
  uint local_4c;
  int *local_48;
  iterator iStack_40;
  int *local_38;
  
  local_48 = (int *)0x0;
  local_38 = (int *)0x0;
  iStack_40._M_current = (int *)0x0;
  iVar3 = -1;
  if (s != 0) {
    local_4c = 0;
    if (0 < this->n) {
      do {
        if ((s >> (local_4c & 0x1f) & 1) != 0) {
          if (iStack_40._M_current == local_38) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_48,iStack_40,(int *)&local_4c);
          }
          else {
            *iStack_40._M_current = local_4c;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
        }
        local_4c = local_4c + 1;
      } while ((int)local_4c < this->n);
    }
    bVar1 = checkIfConnect(this,*local_48,s);
    if (bVar1) {
      uVar2 = (long)iStack_40._M_current - (long)local_48 >> 2;
      if (iStack_40._M_current == local_48) {
        iVar4 = 0;
      }
      else {
        uVar7 = 1;
        iVar4 = 0;
        uVar5 = 0;
        do {
          uVar6 = uVar5 + 1;
          if (uVar6 < uVar2) {
            uVar8 = uVar7;
            do {
              iVar4 = (iVar4 - this->edge[local_48[uVar5]][local_48[uVar8]]) + 1;
              uVar8 = uVar8 + 1;
            } while (uVar8 < uVar2);
          }
          uVar7 = uVar7 + 1;
          uVar5 = uVar6;
        } while (uVar6 != uVar2 + (uVar2 == 0));
      }
      iVar3 = -1;
      if (iVar4 <= k) {
        iVar3 = (int)uVar2;
      }
    }
  }
  if (local_48 != (int *)0x0) {
    operator_delete(local_48);
  }
  return iVar3;
}

Assistant:

int BaoSolver::check(uint32_t s, int k) {
	vector <int> vec; vec.clear();
    if (s == 0) return -1;
	for (int i = 0; i < n; i++) if ((s >> i) & 1) vec.push_back(i);
    if (!checkIfConnect(vec[0], s)) return -1;
	int ret = 0;
	for (int i = 0; i < vec.size(); i++)
		for (int j = i + 1; j < vec.size(); j++) {
			ret += 1 - edge[vec[i]][vec[j]];
		}
	if (ret > k) return -1;
	else return vec.size();
}